

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint32_t absl::lts_20250127::hash_internal::CityHash32(char *s,size_t len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t local_64;
  uint32_t local_60;
  uint32_t b4;
  uint32_t b3;
  uint32_t b2;
  uint32_t b1;
  uint32_t b0;
  size_t iters;
  uint32_t a4;
  uint32_t a3;
  uint32_t a2;
  uint32_t a1;
  uint32_t a0;
  uint32_t f;
  uint32_t g;
  uint32_t h;
  size_t len_local;
  char *s_local;
  
  _g = len;
  len_local = (size_t)s;
  if (len < 0x19) {
    if (len < 0xd) {
      if (len < 5) {
        local_60 = Hash32Len0to4(s,len);
      }
      else {
        local_60 = Hash32Len5to12(s,len);
      }
      local_64 = local_60;
    }
    else {
      local_64 = Hash32Len13to24(s,len);
    }
    s_local._4_4_ = local_64;
  }
  else {
    f = (uint32_t)len;
    a1 = f * -0x3361d2af;
    a0 = a1;
    uVar1 = Fetch32(s + (len - 4));
    uVar1 = Rotate32(uVar1 * -0x3361d2af,0x11);
    uVar2 = Fetch32((char *)(len_local + _g + -8));
    uVar2 = Rotate32(uVar2 * -0x3361d2af,0x11);
    uVar3 = Fetch32((char *)(len_local + _g + -0x10));
    uVar3 = Rotate32(uVar3 * -0x3361d2af,0x11);
    uVar4 = Fetch32((char *)(len_local + _g + -0xc));
    uVar4 = Rotate32(uVar4 * -0x3361d2af,0x11);
    uVar5 = Fetch32((char *)(len_local + _g + -0x14));
    uVar5 = Rotate32(uVar5 * -0x3361d2af,0x11);
    f = uVar1 * 0x1b873593 ^ f;
    uVar1 = Rotate32(f,0x13);
    f = uVar3 * 0x1b873593 ^ uVar1 * 5 + 0xe6546b64;
    uVar1 = Rotate32(f,0x13);
    f = uVar1 * 5 + 0xe6546b64;
    a0 = uVar2 * 0x1b873593 ^ a0;
    uVar1 = Rotate32(a0,0x13);
    a0 = uVar4 * 0x1b873593 ^ uVar1 * 5 + 0xe6546b64;
    uVar1 = Rotate32(a0,0x13);
    a0 = uVar1 * 5 + 0xe6546b64;
    a1 = uVar5 * 0x1b873593 + a1;
    uVar1 = Rotate32(a1,0x13);
    a1 = uVar1 * 5 + 0xe6546b64;
    _b1 = (_g - 1) / 0x14;
    do {
      uVar1 = Fetch32((char *)len_local);
      uVar1 = Rotate32(uVar1 * -0x3361d2af,0x11);
      uVar2 = Fetch32((char *)(len_local + 4));
      uVar3 = Fetch32((char *)(len_local + 8));
      uVar3 = Rotate32(uVar3 * -0x3361d2af,0x11);
      uVar4 = Fetch32((char *)(len_local + 0xc));
      uVar4 = Rotate32(uVar4 * -0x3361d2af,0x11);
      uVar5 = Fetch32((char *)(len_local + 0x10));
      f = uVar1 * 0x1b873593 ^ f;
      uVar6 = Rotate32(f,0x12);
      f = uVar6 * 5 + 0xe6546b64;
      a1 = uVar2 + a1;
      uVar6 = Rotate32(a1,0x13);
      a1 = uVar6 * -0x3361d2af;
      a0 = uVar3 * 0x1b873593 + a0;
      uVar3 = Rotate32(a0,0x12);
      a0 = uVar3 * 5 + 0xe6546b64;
      f = uVar4 * 0x1b873593 + uVar2 ^ f;
      uVar2 = Rotate32(f,0x13);
      f = uVar2 * 5 + 0xe6546b64;
      a0 = uVar5 ^ a0;
      uVar2 = gbswap_32(a0);
      a0 = uVar2 * 5;
      f = uVar5 * 5 + f;
      f = gbswap_32(f);
      a1 = uVar1 * 0x1b873593 + a1;
      std::swap<unsigned_int>(&a1,&f);
      std::swap<unsigned_int>(&a1,&a0);
      len_local = len_local + 0x14;
      _b1 = _b1 - 1;
    } while (_b1 != 0);
    uVar1 = Rotate32(a0,0xb);
    a0 = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(a0,0x11);
    a0 = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(a1,0xb);
    a1 = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(a1,0x11);
    a1 = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(f + a0,0x13);
    f = uVar1 * 5 + 0xe6546b64;
    uVar1 = Rotate32(f,0x11);
    f = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(f + a1,0x13);
    f = uVar1 * 5 + 0xe6546b64;
    uVar1 = Rotate32(f,0x11);
    s_local._4_4_ = uVar1 * -0x3361d2af;
  }
  return s_local._4_4_;
}

Assistant:

uint32_t CityHash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12
               ? (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len))
               : Hash32Len13to24(s, len);
  }

  // len > 24
  uint32_t h = static_cast<uint32_t>(len), g = c1 * h, f = g;

  uint32_t a0 = Rotate32(Fetch32(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = Rotate32(Fetch32(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = Rotate32(Fetch32(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = Rotate32(Fetch32(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = Rotate32(Fetch32(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate32(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate32(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate32(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate32(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate32(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t b0 = Rotate32(Fetch32(s) * c1, 17) * c2;
    uint32_t b1 = Fetch32(s + 4);
    uint32_t b2 = Rotate32(Fetch32(s + 8) * c1, 17) * c2;
    uint32_t b3 = Rotate32(Fetch32(s + 12) * c1, 17) * c2;
    uint32_t b4 = Fetch32(s + 16);
    h ^= b0;
    h = Rotate32(h, 18);
    h = h * 5 + 0xe6546b64;
    f += b1;
    f = Rotate32(f, 19);
    f = f * c1;
    g += b2;
    g = Rotate32(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= b3 + b1;
    h = Rotate32(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= b4;
    g = absl::gbswap_32(g) * 5;
    h += b4 * 5;
    h = absl::gbswap_32(h);
    f += b0;
    PERMUTE3(f, h, g);
    s += 20;
  } while (--iters != 0);
  g = Rotate32(g, 11) * c1;
  g = Rotate32(g, 17) * c1;
  f = Rotate32(f, 11) * c1;
  f = Rotate32(f, 17) * c1;
  h = Rotate32(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate32(h, 17) * c1;
  h = Rotate32(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate32(h, 17) * c1;
  return h;
}